

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rpn.cpp
# Opt level: O1

void rpn_StartOfSectionType(Expression *expr,SectionType type)

{
  char *pcVar1;
  uint8_t *puVar2;
  int *piVar3;
  
  expr->reason = (char *)0x0;
  expr->rpn = (uint8_t *)0x0;
  expr->rpnCapacity = 0;
  expr->rpnLength = 0;
  expr->rpnPatchSize = 0;
  expr->isKnown = false;
  expr->isSymbol = false;
  pcVar1 = (char *)malloc(0x80);
  expr->reason = pcVar1;
  if (pcVar1 != (char *)0x0) {
    builtin_strncpy(pcVar1,"Section type\'s start is not known",0x22);
    puVar2 = reserveSpace(expr,2);
    expr->rpnPatchSize = expr->rpnPatchSize + 2;
    *puVar2 = 'V';
    puVar2[1] = (uint8_t)type;
    return;
  }
  piVar3 = __errno_location();
  pcVar1 = strerror(*piVar3);
  fatalerror("Can\'t allocate err string: %s\n",pcVar1);
}

Assistant:

void rpn_StartOfSectionType(struct Expression *expr, enum SectionType type)
{
	rpn_Init(expr);
	makeUnknown(expr, "Section type's start is not known");

	uint8_t *ptr = reserveSpace(expr, 2);

	expr->rpnPatchSize += 2;
	*ptr++ = RPN_STARTOF_SECTTYPE;
	*ptr++ = type;
}